

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O3

void __thiscall spvtools::opt::IRContext::BuildCFG(IRContext *this)

{
  Module *module;
  CFG *this_00;
  pointer __p;
  __uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_> local_20;
  
  module = (this->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  this_00 = (CFG *)operator_new(0x1c0);
  CFG::CFG(this_00,module);
  local_20._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
  super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl =
       (tuple<spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>)
       (_Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>)0x0;
  std::__uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>::reset
            ((__uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_> *)
             &this->cfg_,this_00);
  std::unique_ptr<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>::~unique_ptr
            ((unique_ptr<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_> *)&local_20);
  *(undefined1 *)&this->valid_analyses_ = (char)this->valid_analyses_ | kAnalysisCFG;
  return;
}

Assistant:

void BuildCFG() {
    cfg_ = MakeUnique<CFG>(module());
    valid_analyses_ = valid_analyses_ | kAnalysisCFG;
  }